

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KokkosProfilingSymbols.cpp
# Opt level: O2

void kokkosp_parse_args(int argc,char **argv_raw)

{
  bool bVar1;
  ostream *poVar2;
  string local_30;
  
  if (2 < argc) {
    poVar2 = std::operator<<((ostream *)&std::cerr,
                             "Error: the Kokkos Caliper connector takes only one argument");
    std::endl<char,std::char_traits<char>>(poVar2);
    return;
  }
  if (argc == 2) {
    cali::ConfigManager::add((ConfigManager *)kokkos::mgr,argv_raw[1]);
    bVar1 = cali::ConfigManager::error((ConfigManager *)kokkos::mgr);
    if (bVar1) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"Kokkos Caliper connector error: ");
      cali::ConfigManager::error_msg_abi_cxx11_(&local_30,(ConfigManager *)kokkos::mgr);
      poVar2 = std::operator<<(poVar2,(string *)&local_30);
      std::endl<char,std::char_traits<char>>(poVar2);
      std::__cxx11::string::~string((string *)&local_30);
    }
    cali::ConfigManager::start((ConfigManager *)kokkos::mgr);
  }
  return;
}

Assistant:

void kokkosp_parse_args(int argc, char* argv_raw[])
{
    if (argc > 2) {
        std::cerr << "Error: the Kokkos Caliper connector takes only one argument" << std::endl;
    }
    if (argc == 2) {
        kokkos::mgr.add(argv_raw[1]);
        if (kokkos::mgr.error()) {
            std::cerr << "Kokkos Caliper connector error: " << kokkos::mgr.error_msg() << std::endl;
        }
        kokkos::mgr.start();
    }
}